

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_0UL>::get
          (SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_0UL> *this,
          ExceptionOrValue *output)

{
  ExceptionOrValue *this_00;
  ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *other;
  Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *tuple;
  TypeByIndex<0UL,_kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *t;
  Promise<void> *other_00;
  ExceptionOr<kj::Promise<void>_> *pEVar1;
  Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *value;
  ExceptionOr<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *hubResult;
  ExceptionOrValue *output_local;
  SplitBranch<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>,_0UL> *this_local;
  
  this_00 = ForkBranchBase::getHubResultRef(&this->super_ForkBranchBase);
  other = ExceptionOrValue::as<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>
                    (this_00);
  tuple = readMaybe<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>(&other->value);
  if (tuple == (Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_> *)0x0) {
    pEVar1 = ExceptionOrValue::as<kj::Promise<void>>(output);
    Maybe<kj::Promise<void>_>::operator=(&pEVar1->value,(void *)0x0);
  }
  else {
    t = get<0ul,kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>&>(tuple);
    other_00 = mv<kj::Promise<void>>(t);
    pEVar1 = ExceptionOrValue::as<kj::Promise<void>>(output);
    Maybe<kj::Promise<void>_>::operator=(&pEVar1->value,other_00);
  }
  Maybe<kj::Exception>::operator=(&output->exception,(Maybe<kj::Exception> *)other);
  ForkBranchBase::releaseHub(&this->super_ForkBranchBase,output);
  return;
}

Assistant:

void get(ExceptionOrValue& output) noexcept override {
    ExceptionOr<T>& hubResult = getHubResultRef().template as<T>();
    KJ_IF_MAYBE(value, hubResult.value) {
      output.as<Element>().value = kj::mv(kj::get<index>(*value));
    } else {
      output.as<Element>().value = nullptr;
    }